

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O3

void __thiscall booster::locale::ios_info::ios_info(ios_info *this)

{
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  this->flags_ = 0;
  this->domain_id_ = 0;
  (this->time_zone_)._M_dataplus._M_p = (pointer)&(this->time_zone_).field_2;
  (this->time_zone_)._M_string_length = 0;
  (this->time_zone_).field_2._M_local_buf[0] = '\0';
  string_set::string_set(&this->datetime_);
  this->d = (data *)0x0;
  locale::time_zone::global_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&this->time_zone_,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return;
}

Assistant:

ios_info::ios_info() : 
            flags_(0),
            domain_id_(0),
            d(0)
        {
            time_zone_ = time_zone::global();
        }